

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrfd_crowdhuman.cpp
# Opt level: O3

void qsort_descent_inplace
               (vector<FaceObject,_std::allocator<FaceObject>_> *faceobjects,int left,int right)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  int iVar9;
  pointer pFVar10;
  int right_00;
  int iVar11;
  pointer pFVar12;
  pointer pFVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  
  pFVar10 = (faceobjects->super__Vector_base<FaceObject,_std::allocator<FaceObject>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    right_00 = right;
    iVar11 = left;
    if (left <= right) {
      fVar1 = pFVar10[(left + right) / 2].prob;
      do {
        lVar14 = (long)iVar11 + -1;
        pFVar13 = pFVar10 + (long)iVar11 + -1;
        iVar9 = iVar11;
        do {
          iVar11 = iVar9;
          pFVar12 = pFVar13;
          fVar2 = pFVar12[1].prob;
          lVar14 = lVar14 + 1;
          pFVar13 = pFVar12 + 1;
          iVar9 = iVar11 + 1;
        } while (fVar1 < fVar2);
        lVar16 = (long)right_00 + 1;
        pfVar8 = &pFVar10[right_00].prob;
        iVar9 = right_00;
        do {
          right_00 = iVar9;
          pfVar15 = pfVar8;
          lVar16 = lVar16 + -1;
          pfVar8 = pfVar15 + -5;
          iVar9 = right_00 + -1;
        } while (*pfVar15 < fVar1);
        if (lVar14 <= lVar16) {
          pFVar12[1].prob = *pfVar15;
          fVar6 = (pFVar13->rect).x;
          fVar7 = (pFVar13->rect).y;
          uVar3 = *(undefined8 *)&pFVar12[1].rect.width;
          fVar5 = (((FaceObject *)(pfVar15 + -4))->rect).y;
          uVar4 = *(undefined8 *)(pfVar15 + -2);
          (pFVar13->rect).x = (((FaceObject *)(pfVar15 + -4))->rect).x;
          (pFVar13->rect).y = fVar5;
          *(undefined8 *)&pFVar12[1].rect.width = uVar4;
          (((FaceObject *)(pfVar15 + -4))->rect).x = fVar6;
          (((FaceObject *)(pfVar15 + -4))->rect).y = fVar7;
          *(undefined8 *)(pfVar15 + -2) = uVar3;
          *pfVar15 = fVar2;
          right_00 = right_00 + -1;
          iVar11 = iVar11 + 1;
        }
      } while (iVar11 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace(faceobjects,left,right_00);
      pFVar10 = (faceobjects->super__Vector_base<FaceObject,_std::allocator<FaceObject>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    left = iVar11;
  } while (iVar11 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<FaceObject>& faceobjects, int left, int right)
{
    int i = left;
    int j = right;
    float p = faceobjects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (faceobjects[i].prob > p)
            i++;

        while (faceobjects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(faceobjects[i], faceobjects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(faceobjects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(faceobjects, i, right);
        }
    }
}